

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O1

void __thiscall BasicBlock::UnlinkSucc(BasicBlock *this,BasicBlock *block,bool doCleanPred)

{
  code *pcVar1;
  bool bVar2;
  Type *ppFVar3;
  undefined4 *puVar4;
  undefined1 local_40 [8];
  EditingIterator iter;
  
  local_40 = (undefined1  [8])&this->succList;
  iter.super_Iterator.current = (NodeBase *)0x0;
  iter.super_Iterator.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_40;
  do {
    bVar2 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::Next
                      ((EditingIterator *)local_40);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0xccd,"((0))","Edge not found.");
      if (bVar2) {
        *puVar4 = 0;
        return;
      }
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    ppFVar3 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                        ((Iterator *)local_40);
  } while ((*ppFVar3)->succBlock != block);
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::UnlinkCurrentNode
            ((EditingIterator *)local_40);
  if (doCleanPred) {
    UnlinkPred(block,this,false);
  }
  return;
}

Assistant:

void
BasicBlock::UnlinkSucc(BasicBlock *block, bool doCleanPred)
{
    FOREACH_SLISTBASECOUNTED_ENTRY_EDITING(FlowEdge*, edge, this->GetSuccList(), iter)
    {
        if (edge->GetSucc() == block)
        {
            iter.UnlinkCurrent();
            if (doCleanPred)
            {
                block->UnlinkPred(this, false);
            }
            return;
        }
    } NEXT_SLISTBASECOUNTED_ENTRY_EDITING;
    AssertMsg(UNREACHED, "Edge not found.");
}